

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_21_term(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  PVIPNode *local_38;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  if (G->val[-3] == (PVIPNode *)0x0) {
    local_38 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_38 = G->val[-3];
  }
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_CONTEXTUALIZER_ARRAY,local_38);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_21_term(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define t G->val[-1]
#define b G->val[-2]
#define e G->val[-3]
  yyprintf((stderr, "do yy_21_term"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = CHILDREN1(PVIP_NODE_CONTEXTUALIZER_ARRAY,  MAYBE(e)); }\n"));
  yy = CHILDREN1(PVIP_NODE_CONTEXTUALIZER_ARRAY,  MAYBE(e)); ;
#undef t
#undef b
#undef e
}